

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O1

App * __thiscall CLI::App::needs(App *this,App *app)

{
  OptionNotFound *pOVar1;
  App *local_68;
  string local_60;
  string local_40;
  
  local_68 = app;
  if (app == (App *)0x0) {
    pOVar1 = (OptionNotFound *)__cxa_allocate_exception(0x38);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"nullptr passed","");
    OptionNotFound::OptionNotFound(pOVar1,&local_40);
    __cxa_throw(pOVar1,&OptionNotFound::typeinfo,Error::~Error);
  }
  if (app != this) {
    ::std::
    _Rb_tree<CLI::App*,CLI::App*,std::_Identity<CLI::App*>,std::less<CLI::App*>,std::allocator<CLI::App*>>
    ::_M_insert_unique<CLI::App*const&>
              ((_Rb_tree<CLI::App*,CLI::App*,std::_Identity<CLI::App*>,std::less<CLI::App*>,std::allocator<CLI::App*>>
                *)&this->need_subcommands_,&local_68);
    return this;
  }
  pOVar1 = (OptionNotFound *)__cxa_allocate_exception(0x38);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"cannot self reference in needs","");
  OptionNotFound::OptionNotFound(pOVar1,&local_60);
  __cxa_throw(pOVar1,&OptionNotFound::typeinfo,Error::~Error);
}

Assistant:

App *needs(App *app) {
        if(app == nullptr) {
            throw OptionNotFound("nullptr passed");
        }
        if(app == this) {
            throw OptionNotFound("cannot self reference in needs");
        }
        need_subcommands_.insert(app);
        return this;
    }